

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_inc.h
# Opt level: O1

void CreateBackwardReferencesNH35
               (size_t num_bytes,size_t position,uint8_t *ringbuffer,size_t ringbuffer_mask,
               ContextLut literal_context_lut,BrotliEncoderParams *params,Hasher *hasher,
               int *dist_cache,size_t *last_insert_len,Command *commands,size_t *num_commands,
               size_t *num_literals,BackwardReferenceFromDecoder *backward_references,
               size_t *back_refs_position,size_t back_refs_size)

{
  uint8_t *puVar1;
  byte bVar2;
  uint32_t uVar3;
  long lVar4;
  bool bVar5;
  int iVar6;
  ushort uVar7;
  int iVar8;
  ulong uVar9;
  byte bVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  int iVar18;
  ulong uVar19;
  ulong uVar20;
  long lVar21;
  ulong uVar22;
  uint8_t uVar23;
  ushort uVar24;
  ulong uVar25;
  uint8_t *puVar26;
  long lVar27;
  ulong uVar28;
  uint32_t uVar29;
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  bool bVar33;
  ulong local_130;
  ulong local_128;
  ulong local_110;
  ulong local_108;
  ulong local_100;
  ulong local_f0;
  ulong local_d8;
  ulong local_c8;
  size_t *local_b8;
  ulong auStack_88 [4];
  long local_68;
  ulong local_60;
  ulong local_58;
  ulong local_50;
  long local_48;
  long local_40;
  ulong local_38;
  
  local_130 = *(ulong *)dist_cache;
  local_60 = position + num_bytes;
  local_38 = (position - 7) + num_bytes;
  if (num_bytes < 8) {
    local_38 = position;
  }
  local_68 = 0x200;
  if (*(int *)(literal_context_lut + 4) < 9) {
    local_68 = 0x40;
  }
  if (local_60 <= position + 8) {
    local_b8 = last_insert_len;
LAB_0010f164:
    *(ulong *)dist_cache = (local_130 + local_60) - position;
    *(long *)commands = *(long *)commands + ((long)local_b8 - (long)last_insert_len >> 4);
    return;
  }
  uVar16 = (1L << (literal_context_lut[8] & 0x3f)) - 0x10;
  local_40 = *(long *)(literal_context_lut + 0x10);
  local_c8 = local_68 + position;
  lVar4 = *(long *)&(params->hasher).num_last_distances_to_check;
  local_58 = ringbuffer_mask & 0xffffffff;
  local_50 = (ulong)(uint)((int)local_68 * 4);
  auStack_88[3] = local_60 - 7;
  local_48 = (position - 1) + num_bytes;
  local_b8 = last_insert_len;
  uVar19 = local_60;
  local_128 = position;
LAB_0010e29e:
  uVar19 = uVar19 - local_128;
  uVar31 = uVar16;
  if (local_128 < uVar16) {
    uVar31 = local_128;
  }
  uVar22 = local_128 & ringbuffer_mask;
  puVar1 = ringbuffer + uVar22;
  uVar23 = ringbuffer[uVar22];
  local_110 = (ulong)*(int *)&(hasher->common).extra;
  local_f0 = 0x7e4;
  local_58._0_4_ = (uint)ringbuffer_mask;
  if ((local_128 - local_110 < local_128) &&
     (uVar14 = (ulong)((uint)(local_128 - local_110) & (uint)local_58), uVar23 == ringbuffer[uVar14]
     )) {
    if (7 < uVar19) {
      uVar9 = uVar19 & 0xfffffffffffffff8;
      puVar26 = ringbuffer + uVar9 + uVar22;
      lVar27 = 0;
      uVar20 = 0;
LAB_0010e324:
      if (*(ulong *)(puVar1 + uVar20 * 8) == *(ulong *)(ringbuffer + uVar20 * 8 + uVar14))
      goto code_r0x0010e336;
      uVar9 = *(ulong *)(ringbuffer + uVar20 * 8 + uVar14) ^ *(ulong *)(puVar1 + uVar20 * 8);
      uVar14 = 0;
      if (uVar9 != 0) {
        for (; (uVar9 >> uVar14 & 1) == 0; uVar14 = uVar14 + 1) {
        }
      }
      uVar20 = (uVar14 >> 3 & 0x1fffffff) - lVar27;
      goto LAB_0010e357;
    }
    uVar9 = 0;
    puVar26 = puVar1;
LAB_0010f12a:
    uVar28 = uVar19 & 7;
    uVar20 = uVar9;
    if (uVar28 != 0) {
      uVar15 = uVar9 | uVar28;
      do {
        uVar20 = uVar9;
        if (ringbuffer[uVar9 + uVar14] != *puVar26) break;
        puVar26 = puVar26 + 1;
        uVar9 = uVar9 + 1;
        uVar28 = uVar28 - 1;
        uVar20 = uVar15;
      } while (uVar28 != 0);
    }
LAB_0010e357:
    if ((uVar20 < 4) || (uVar14 = uVar20 * 0x87 + 0x78f, uVar14 < 0x7e5)) goto LAB_0010e38e;
    uVar23 = puVar1[uVar20];
    local_f0 = uVar14;
  }
  else {
LAB_0010e38e:
    local_110 = 0;
    uVar20 = 0;
  }
  lVar27 = *(long *)(ringbuffer + uVar22);
  lVar21 = 0;
  do {
    *(ulong *)((long)auStack_88 + lVar21) =
         (ulong)((uint)(ushort)((ulong)(lVar27 * -0x42e1ca5843000000) >> 0x30) + (int)lVar21 &
                0xffff);
    lVar21 = lVar21 + 8;
  } while (lVar21 == 8);
  uVar12 = (uint)local_128;
  uVar9 = (ulong)((uint)uVar19 & 7);
  uVar14 = uVar19 & 0xfffffffffffffff8;
  lVar27 = 0;
  do {
    uVar13 = *(uint *)(lVar4 + auStack_88[lVar27] * 4);
    uVar11 = (uint)local_58 & uVar13;
    if (((uVar23 == ringbuffer[uVar20 + uVar11]) && (local_128 != uVar13)) &&
       (uVar28 = local_128 - uVar13, uVar28 <= uVar31)) {
      if (7 < uVar19) {
        lVar21 = 0;
        uVar15 = 0;
LAB_0010e451:
        if (*(ulong *)(puVar1 + uVar15 * 8) == *(ulong *)(ringbuffer + uVar15 * 8 + (ulong)uVar11))
        goto code_r0x0010e463;
        uVar30 = *(ulong *)(ringbuffer + uVar15 * 8 + (ulong)uVar11) ^
                 *(ulong *)(puVar1 + uVar15 * 8);
        uVar15 = 0;
        if (uVar30 != 0) {
          for (; (uVar30 >> uVar15 & 1) == 0; uVar15 = uVar15 + 1) {
          }
        }
        uVar15 = (uVar15 >> 3 & 0x1fffffff) - lVar21;
        goto LAB_0010e495;
      }
      puVar26 = puVar1;
      uVar30 = 0;
LAB_0010e4f1:
      uVar15 = uVar30;
      if (uVar9 != 0) {
        uVar32 = uVar9 | uVar30;
        uVar17 = uVar9;
        do {
          uVar15 = uVar30;
          if (ringbuffer[uVar30 + uVar11] != *puVar26) break;
          puVar26 = puVar26 + 1;
          uVar30 = uVar30 + 1;
          uVar17 = uVar17 - 1;
          uVar15 = uVar32;
        } while (uVar17 != 0);
      }
LAB_0010e495:
      if (3 < uVar15) {
        iVar18 = 0x1f;
        if ((uint)uVar28 != 0) {
          for (; (uint)uVar28 >> iVar18 == 0; iVar18 = iVar18 + -1) {
          }
        }
        uVar30 = (ulong)(iVar18 * -0x1e + 0x780) + uVar15 * 0x87;
        if (local_f0 < uVar30) {
          uVar23 = puVar1[uVar15];
          uVar20 = uVar15;
          local_110 = uVar28;
          local_f0 = uVar30;
        }
      }
    }
    bVar33 = lVar27 == 0;
    lVar27 = lVar27 + 1;
  } while (bVar33);
  *(uint *)(lVar4 + *(long *)((long)auStack_88 + (ulong)(uVar12 & 8)) * 4) = uVar12;
  if (0x1f < uVar19 && (local_128 & 3) == 0) {
    uVar9 = (params->dist).max_distance;
    if (uVar9 <= local_128) {
      uVar29 = (params->dist).distance_postfix_bits;
      iVar18 = *(int *)((long)&(params->dictionary).words + 4);
      uVar3 = (params->dictionary).num_transforms;
      uVar28 = (ulong)((uint)uVar19 & 7);
      do {
        uVar13 = uVar29 & 0x3fffffff;
        bVar10 = ringbuffer[uVar9 & ringbuffer_mask];
        bVar2 = ringbuffer[uVar9 + 0x20 & ringbuffer_mask];
        if (uVar13 < 0x1000000) {
          lVar27 = *(long *)&(params->dist).alphabet_size_max;
          uVar11 = *(uint *)(lVar27 + (ulong)uVar13 * 4);
          *(int *)(lVar27 + (ulong)uVar13 * 4) = (int)uVar9;
          if ((uVar9 == local_128) && (uVar11 != 0xffffffff)) {
            uVar13 = uVar12 - uVar11;
            if (uVar13 <= uVar31) {
              if (7 < uVar19) {
                lVar27 = 0;
                uVar15 = 0;
LAB_0010e620:
                if (*(ulong *)(puVar1 + uVar15 * 8) ==
                    *(ulong *)(ringbuffer + uVar15 * 8 + (ulong)(uVar11 & (uint)local_58)))
                goto code_r0x0010e632;
                uVar30 = *(ulong *)(ringbuffer + uVar15 * 8 + (ulong)(uVar11 & (uint)local_58)) ^
                         *(ulong *)(puVar1 + uVar15 * 8);
                uVar15 = 0;
                if (uVar30 != 0) {
                  for (; (uVar30 >> uVar15 & 1) == 0; uVar15 = uVar15 + 1) {
                  }
                }
                uVar15 = (uVar15 >> 3 & 0x1fffffff) - lVar27;
                goto LAB_0010e698;
              }
              puVar26 = puVar1;
              uVar30 = 0;
LAB_0010e6dc:
              uVar15 = uVar30;
              if (uVar28 != 0) {
                uVar32 = uVar28 | uVar30;
                uVar17 = uVar28;
                do {
                  uVar15 = uVar30;
                  if (ringbuffer[uVar30 + (uVar11 & (uint)local_58)] != *puVar26) break;
                  puVar26 = puVar26 + 1;
                  uVar30 = uVar30 + 1;
                  uVar17 = uVar17 - 1;
                  uVar15 = uVar32;
                } while (uVar17 != 0);
              }
LAB_0010e698:
              if ((3 < uVar15) && (uVar20 < uVar15)) {
                iVar8 = 0x1f;
                if (uVar13 != 0) {
                  for (; uVar13 >> iVar8 == 0; iVar8 = iVar8 + -1) {
                  }
                }
                uVar30 = (ulong)(iVar8 * -0x1e + 0x780) + uVar15 * 0x87;
                if (local_f0 < uVar30) {
                  uVar20 = uVar15;
                  local_110 = (ulong)uVar13;
                  local_f0 = uVar30;
                }
              }
            }
          }
        }
        uVar29 = ~(uint)bVar10 * uVar3 + (uint)bVar2 + uVar29 * iVar18 + 1;
        uVar9 = uVar9 + 4;
      } while (uVar9 <= local_128);
      (params->dist).distance_postfix_bits = uVar29;
    }
    (params->dist).max_distance = local_128 + 4;
  }
  if (0x7e4 < local_f0) {
    uVar31 = local_48 - local_128;
    iVar18 = 0;
LAB_0010e76b:
    uVar22 = local_128;
    uVar9 = uVar31 >> 3;
    uVar19 = uVar19 - 1;
    uVar14 = uVar20 - 1;
    if (uVar19 <= uVar20 - 1) {
      uVar14 = uVar19;
    }
    if (4 < *(int *)(literal_context_lut + 4)) {
      uVar14 = 0;
    }
    uVar28 = local_128 + 1;
    uVar15 = uVar16;
    if (uVar28 < uVar16) {
      uVar15 = uVar28;
    }
    puVar1 = ringbuffer + (uVar28 & ringbuffer_mask);
    uVar23 = puVar1[uVar14];
    local_d8 = (ulong)*(int *)&(hasher->common).extra;
    local_108 = 0x7e4;
    if ((uVar28 - local_d8 < uVar28) &&
       (uVar12 = (uint)(uVar28 - local_d8) & (uint)local_58, uVar23 == ringbuffer[uVar14 + uVar12]))
    {
      if (7 < uVar19) {
        lVar27 = 0;
        uVar30 = 0;
LAB_0010e808:
        if (*(ulong *)(puVar1 + uVar30 * 8) == *(ulong *)(ringbuffer + uVar30 * 8 + (ulong)uVar12))
        goto code_r0x0010e816;
        uVar17 = *(ulong *)(ringbuffer + uVar30 * 8 + (ulong)uVar12) ^
                 *(ulong *)(puVar1 + uVar30 * 8);
        uVar30 = 0;
        if (uVar17 != 0) {
          for (; (uVar17 >> uVar30 & 1) == 0; uVar30 = uVar30 + 1) {
          }
        }
        local_100 = (uVar30 >> 3 & 0x1fffffff) - lVar27;
        goto LAB_0010e842;
      }
      local_100 = 0;
      puVar26 = puVar1;
      goto LAB_0010ec78;
    }
    goto LAB_0010e880;
  }
  local_130 = local_130 + 1;
  position = local_128 + 1;
  if ((num_literals == (size_t *)0x0) && (local_c8 < position)) {
    if (local_50 + local_c8 < position) {
      uVar19 = local_128 + 0x11;
      if (auStack_88[3] <= local_128 + 0x11) {
        uVar19 = auStack_88[3];
      }
      for (; position < uVar19; position = position + 4) {
        *(uint *)(lVar4 + (ulong)((uint)(ushort)((ulong)(*(long *)(ringbuffer +
                                                                  (position & ringbuffer_mask)) *
                                                        -0x42e1ca5843000000) >> 0x30) +
                                  ((uint)position & 8) & 0xffff) * 4) = (uint)position;
        local_130 = local_130 + 4;
      }
    }
    else {
      uVar19 = local_128 + 9;
      if (auStack_88[3] <= local_128 + 9) {
        uVar19 = auStack_88[3];
      }
      for (; position < uVar19; position = position + 2) {
        *(uint *)(lVar4 + (ulong)((uint)(ushort)((ulong)(*(long *)(ringbuffer +
                                                                  (position & ringbuffer_mask)) *
                                                        -0x42e1ca5843000000) >> 0x30) +
                                  ((uint)position & 8) & 0xffff) * 4) = (uint)position;
        local_130 = local_130 + 2;
      }
    }
  }
  goto LAB_0010f0dd;
code_r0x0010e336:
  uVar20 = uVar20 + 1;
  lVar27 = lVar27 + -8;
  if (uVar19 >> 3 == uVar20) goto LAB_0010f12a;
  goto LAB_0010e324;
code_r0x0010e463:
  uVar15 = uVar15 + 1;
  lVar21 = lVar21 + -8;
  puVar26 = ringbuffer + uVar14 + uVar22;
  uVar30 = uVar14;
  if (uVar19 >> 3 == uVar15) goto LAB_0010e4f1;
  goto LAB_0010e451;
code_r0x0010e632:
  uVar15 = uVar15 + 1;
  lVar27 = lVar27 + -8;
  puVar26 = ringbuffer + uVar14 + uVar22;
  uVar30 = uVar14;
  if (uVar19 >> 3 == uVar15) goto LAB_0010e6dc;
  goto LAB_0010e620;
code_r0x0010e816:
  uVar30 = uVar30 + 1;
  lVar27 = lVar27 + -8;
  if (uVar9 == uVar30) goto code_r0x0010e824;
  goto LAB_0010e808;
code_r0x0010e824:
  local_100 = -lVar27;
  puVar26 = puVar1 + -lVar27;
LAB_0010ec78:
  uVar30 = uVar19 & 7;
  for (; (uVar30 != 0 && (ringbuffer[local_100 + uVar12] == *puVar26)); local_100 = local_100 + 1) {
    puVar26 = puVar26 + 1;
    uVar30 = uVar30 - 1;
  }
LAB_0010e842:
  if (local_100 < 4) {
    local_d8 = 0;
    local_100 = 0;
  }
  else {
    uVar30 = local_100 * 0x87 + 0x78f;
    if (uVar30 < 0x7e5) {
LAB_0010e880:
      local_d8 = 0;
      local_100 = 0;
    }
    else {
      uVar23 = puVar1[local_100];
      uVar14 = local_100;
      local_108 = uVar30;
    }
  }
  lVar27 = *(long *)(ringbuffer + (uVar28 & ringbuffer_mask));
  lVar21 = 0;
  do {
    *(ulong *)((long)auStack_88 + lVar21) =
         (ulong)((uint)(ushort)((ulong)(lVar27 * -0x42e1ca5843000000) >> 0x30) + (int)lVar21 &
                0xffff);
    lVar21 = lVar21 + 8;
  } while (lVar21 == 8);
  uVar12 = (uint)uVar28;
  uVar30 = (ulong)((uint)uVar19 & 7);
  lVar27 = 0;
LAB_0010e8d2:
  uVar13 = *(uint *)(lVar4 + auStack_88[lVar27] * 4);
  uVar11 = (uint)local_58 & uVar13;
  if (((uVar23 == ringbuffer[uVar14 + uVar11]) && (uVar28 != uVar13)) &&
     (uVar17 = uVar28 - uVar13, uVar17 <= uVar15)) {
    uVar32 = uVar30;
    if (7 < uVar19) {
      lVar21 = 0;
      uVar25 = 0;
LAB_0010e91e:
      if (*(ulong *)(puVar1 + uVar25 * 8) == *(ulong *)(ringbuffer + uVar25 * 8 + (ulong)uVar11))
      goto code_r0x0010e92c;
      uVar25 = *(ulong *)(ringbuffer + uVar25 * 8 + (ulong)uVar11) ^ *(ulong *)(puVar1 + uVar25 * 8)
      ;
      uVar32 = 0;
      if (uVar25 != 0) {
        for (; (uVar25 >> uVar32 & 1) == 0; uVar32 = uVar32 + 1) {
        }
      }
      uVar25 = (uVar32 >> 3 & 0x1fffffff) - lVar21;
      goto LAB_0010e959;
    }
    uVar25 = 0;
    puVar26 = puVar1;
    goto joined_r0x0010e9d1;
  }
  goto LAB_0010e9b5;
code_r0x0010e92c:
  uVar25 = uVar25 + 1;
  lVar21 = lVar21 + -8;
  if (uVar9 == uVar25) goto code_r0x0010e93a;
  goto LAB_0010e91e;
code_r0x0010e93a:
  uVar25 = -lVar21;
  puVar26 = puVar1 + -lVar21;
joined_r0x0010e9d1:
  for (; (uVar32 != 0 && (ringbuffer[uVar25 + uVar11] == *puVar26)); uVar25 = uVar25 + 1) {
    uVar32 = uVar32 - 1;
    puVar26 = puVar26 + 1;
  }
LAB_0010e959:
  if (3 < uVar25) {
    iVar8 = 0x1f;
    if ((uint)uVar17 != 0) {
      for (; (uint)uVar17 >> iVar8 == 0; iVar8 = iVar8 + -1) {
      }
    }
    uVar32 = (ulong)(iVar8 * -0x1e + 0x780) + uVar25 * 0x87;
    if (local_108 < uVar32) {
      uVar23 = puVar1[uVar25];
      uVar14 = uVar25;
      local_108 = uVar32;
      local_100 = uVar25;
      local_d8 = uVar17;
    }
  }
LAB_0010e9b5:
  bVar33 = lVar27 != 0;
  lVar27 = lVar27 + 1;
  if (bVar33) goto LAB_0010e9f3;
  goto LAB_0010e8d2;
LAB_0010e9f3:
  *(uint *)(lVar4 + *(long *)((long)auStack_88 + (ulong)(uVar12 & 8)) * 4) = uVar12;
  if (uVar19 < 0x20 || (uVar28 & 3) != 0) goto LAB_0010ebe3;
  uVar14 = (params->dist).max_distance;
  if (uVar14 <= uVar28) {
    uVar29 = (params->dist).distance_postfix_bits;
    iVar8 = *(int *)((long)&(params->dictionary).words + 4);
    uVar3 = (params->dictionary).num_transforms;
LAB_0010ea74:
    uVar13 = uVar29 & 0x3fffffff;
    bVar10 = ringbuffer[uVar14 & ringbuffer_mask];
    bVar2 = ringbuffer[uVar14 + 0x20 & ringbuffer_mask];
    if (uVar13 < 0x1000000) {
      lVar27 = *(long *)&(params->dist).alphabet_size_max;
      uVar11 = *(uint *)(lVar27 + (ulong)uVar13 * 4);
      *(int *)(lVar27 + (ulong)uVar13 * 4) = (int)uVar14;
      if ((uVar14 == uVar28) && (uVar11 != 0xffffffff)) {
        uVar13 = uVar12 - uVar11;
        if (uVar13 <= uVar15) {
          lVar27 = 0;
          uVar30 = 0;
LAB_0010eafd:
          if (*(ulong *)(puVar1 + uVar30 * 8) ==
              *(ulong *)(ringbuffer + uVar30 * 8 + (ulong)(uVar11 & (uint)local_58)))
          goto code_r0x0010eb0b;
          uVar17 = *(ulong *)(ringbuffer + uVar30 * 8 + (ulong)(uVar11 & (uint)local_58)) ^
                   *(ulong *)(puVar1 + uVar30 * 8);
          uVar30 = 0;
          if (uVar17 != 0) {
            for (; (uVar17 >> uVar30 & 1) == 0; uVar30 = uVar30 + 1) {
            }
          }
          uVar30 = (uVar30 >> 3 & 0x1fffffff) - lVar27;
          goto LAB_0010eb57;
        }
      }
    }
    goto LAB_0010eac7;
  }
  goto LAB_0010ebc2;
code_r0x0010eb0b:
  uVar30 = uVar30 + 1;
  lVar27 = lVar27 + -8;
  if (uVar9 == uVar30) goto code_r0x0010eb19;
  goto LAB_0010eafd;
code_r0x0010eb19:
  uVar17 = (ulong)((uint)uVar19 & 7);
  for (uVar30 = -lVar27;
      (uVar17 != 0 && (ringbuffer[uVar30 + (uVar11 & (uint)local_58)] == puVar1[uVar30]));
      uVar30 = uVar30 + 1) {
    uVar17 = uVar17 - 1;
  }
LAB_0010eb57:
  if ((3 < uVar30) && (local_100 < uVar30)) {
    iVar6 = 0x1f;
    if (uVar13 != 0) {
      for (; uVar13 >> iVar6 == 0; iVar6 = iVar6 + -1) {
      }
    }
    uVar17 = (ulong)(iVar6 * -0x1e + 0x780) + uVar30 * 0x87;
    if (local_108 < uVar17) {
      local_108 = uVar17;
      local_100 = uVar30;
      local_d8 = (ulong)uVar13;
    }
  }
LAB_0010eac7:
  uVar29 = ~(uint)bVar10 * uVar3 + (uint)bVar2 + uVar29 * iVar8 + 1;
  uVar14 = uVar14 + 4;
  if (uVar28 < uVar14) goto LAB_0010eba7;
  goto LAB_0010ea74;
LAB_0010eba7:
  (params->dist).distance_postfix_bits = uVar29;
LAB_0010ebc2:
  (params->dist).max_distance = local_128 + 5;
LAB_0010ebe3:
  bVar33 = local_f0 + 0xaf <= local_108;
  iVar8 = iVar18;
  if (bVar33) {
    local_130 = local_130 + 1;
    local_110 = local_d8;
    uVar20 = local_100;
    local_f0 = local_108;
    local_128 = uVar28;
    iVar8 = iVar18 + 1;
  }
  bVar5 = 2 < iVar18;
  uVar31 = uVar31 - 1;
  iVar18 = iVar8;
  if (!bVar33 || (bVar5 || local_60 <= uVar22 + 9)) goto LAB_0010ed44;
  goto LAB_0010e76b;
LAB_0010ed44:
  uVar19 = local_128 + local_40;
  if (uVar16 <= uVar19) {
    uVar19 = uVar16;
  }
  if (local_110 <= uVar19) {
    uVar31 = (ulong)*(int *)&(hasher->common).extra;
    uVar12 = 0;
    bVar33 = false;
    if (local_110 != uVar31) {
      uVar22 = (ulong)*(int *)((long)&(hasher->common).extra + 4);
      if (local_110 == uVar22) {
        uVar12 = 1;
      }
      else {
        uVar31 = (local_110 + 3) - uVar31;
        if (uVar31 < 7) {
          bVar10 = (byte)((int)uVar31 << 2);
          uVar12 = 0x9750468;
        }
        else {
          uVar22 = (local_110 + 3) - uVar22;
          if (6 < uVar22) {
            if (local_110 != (long)(int)(hasher->common).dict_num_lookups) {
              bVar33 = local_110 != (long)*(int *)((long)&(hasher->common).dict_num_lookups + 4);
              uVar12 = 3;
              goto LAB_0010ee2b;
            }
            uVar12 = 2;
            goto LAB_0010ee29;
          }
          bVar10 = (byte)((int)uVar22 << 2);
          uVar12 = 0xfdb1ace;
        }
        uVar12 = uVar12 >> (bVar10 & 0x1f) & 0xf;
      }
LAB_0010ee29:
      bVar33 = false;
    }
LAB_0010ee2b:
    if (!bVar33) {
      uVar31 = (ulong)uVar12;
      goto LAB_0010ee3d;
    }
  }
  uVar31 = local_110 + 0xf;
LAB_0010ee3d:
  if ((local_110 <= uVar19) && (uVar31 != 0)) {
    *(int *)((long)&(hasher->common).dict_num_lookups + 4) = (int)(hasher->common).dict_num_lookups;
    *(void **)((long)&(hasher->common).extra + 4) = (hasher->common).extra;
    *(int *)&(hasher->common).extra = (int)local_110;
  }
  uVar12 = (uint)local_130;
  *(uint *)local_b8 = uVar12;
  uVar13 = (uint)uVar20;
  *(uint *)((long)local_b8 + 4) = uVar13;
  uVar19 = (ulong)*(uint *)(literal_context_lut + 0x44) + 0x10;
  if (uVar31 < uVar19) {
    *(short *)((long)local_b8 + 0xe) = (short)uVar31;
    uVar11 = 0;
  }
  else {
    bVar10 = (byte)*(int *)(literal_context_lut + 0x40);
    uVar31 = ((uVar31 - *(uint *)(literal_context_lut + 0x44)) + (4L << (bVar10 & 0x3f))) - 0x10;
    uVar11 = 0x1f;
    if ((uint)uVar31 != 0) {
      for (; (uint)uVar31 >> uVar11 == 0; uVar11 = uVar11 - 1) {
      }
    }
    uVar11 = (uVar11 ^ 0xffffffe0) + 0x1f;
    bVar33 = (uVar31 >> ((ulong)uVar11 & 0x3f) & 1) != 0;
    iVar18 = uVar11 - *(int *)(literal_context_lut + 0x40);
    *(ushort *)((long)local_b8 + 0xe) =
         (short)((uint)bVar33 + iVar18 * 2 + 0xfffe << (bVar10 & 0x3f)) +
         (short)uVar19 + (~(ushort)(-1 << (bVar10 & 0x1f)) & (ushort)uVar31) | (short)iVar18 * 0x400
    ;
    uVar11 = (uint)(uVar31 - ((ulong)bVar33 + 2 << ((byte)uVar11 & 0x3f)) >> (bVar10 & 0x3f));
  }
  *(uint *)(local_b8 + 1) = uVar11;
  if (5 < local_130) {
    if (local_130 < 0x82) {
      uVar12 = 0x1f;
      uVar11 = (uint)(local_130 - 2);
      if (uVar11 != 0) {
        for (; uVar11 >> uVar12 == 0; uVar12 = uVar12 - 1) {
        }
      }
      uVar12 = (int)(local_130 - 2 >> ((char)(uVar12 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
               (uVar12 ^ 0xffffffe0) * 2 + 0x40;
    }
    else if (local_130 < 0x842) {
      uVar11 = 0x1f;
      if (uVar12 - 0x42 != 0) {
        for (; uVar12 - 0x42 >> uVar11 == 0; uVar11 = uVar11 - 1) {
        }
      }
      uVar12 = (uVar11 ^ 0xffe0) + 0x2a;
    }
    else {
      uVar12 = 0x15;
      if (0x1841 < local_130) {
        uVar12 = (uint)(ushort)(0x17 - (local_130 < 0x5842));
      }
    }
  }
  uVar19 = (ulong)(int)uVar13;
  if (uVar19 < 10) {
    uVar11 = uVar13 - 2;
  }
  else if (uVar19 < 0x86) {
    uVar13 = 0x1f;
    uVar11 = (uint)(uVar19 - 6);
    if (uVar11 != 0) {
      for (; uVar11 >> uVar13 == 0; uVar13 = uVar13 - 1) {
      }
    }
    uVar11 = (int)(uVar19 - 6 >> ((char)(uVar13 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
             (uVar13 ^ 0xffffffe0) * 2 + 0x42;
  }
  else {
    uVar11 = 0x17;
    if (uVar19 < 0x846) {
      uVar11 = 0x1f;
      if (uVar13 - 0x46 != 0) {
        for (; uVar13 - 0x46 >> uVar11 == 0; uVar11 = uVar11 - 1) {
        }
      }
      uVar11 = (uVar11 ^ 0xffe0) + 0x2c;
    }
  }
  uVar7 = (ushort)uVar11;
  uVar24 = (uVar7 & 7) + ((ushort)uVar12 & 7) * 8;
  if ((((*(ushort *)((long)local_b8 + 0xe) & 0x3ff) == 0) && ((ushort)uVar12 < 8)) && (uVar7 < 0x10)
     ) {
    if (7 < uVar7) {
      uVar24 = uVar24 | 0x40;
    }
  }
  else {
    iVar18 = ((uVar12 & 0xffff) >> 3) * 3 + ((uVar11 & 0xffff) >> 3);
    uVar24 = uVar24 + ((ushort)(0x520d40 >> ((char)iVar18 * '\x02' & 0x1fU)) & 0xc0) +
                      (short)iVar18 * 0x40 + 0x40;
  }
  *(ushort *)((long)local_b8 + 0xc) = uVar24;
  *num_commands = *num_commands + local_130;
  position = local_128 + uVar20;
  uVar19 = local_38;
  if (position < local_38) {
    uVar19 = position;
  }
  uVar31 = local_128 + 2;
  if (local_110 < uVar20 >> 2) {
    uVar22 = position + local_110 * -4;
    if (uVar22 < uVar31) {
      uVar22 = uVar31;
    }
    uVar31 = uVar22;
    if (uVar19 < uVar22) {
      uVar31 = uVar19;
    }
  }
  local_c8 = local_68 + uVar20 * 2 + local_128;
  local_b8 = local_b8 + 2;
  if (uVar31 < uVar19) {
    do {
      *(uint *)(lVar4 + (ulong)((uint)(ushort)((ulong)(*(long *)(ringbuffer +
                                                                (uVar31 & ringbuffer_mask)) *
                                                      -0x42e1ca5843000000) >> 0x30) +
                                ((uint)uVar31 & 8) & 0xffff) * 4) = (uint)uVar31;
      uVar31 = uVar31 + 1;
    } while (uVar19 != uVar31);
  }
  local_130 = 0;
LAB_0010f0dd:
  uVar19 = local_60;
  local_128 = position;
  if (local_60 <= position + 8) goto LAB_0010f164;
  goto LAB_0010e29e;
}

Assistant:

static BROTLI_NOINLINE void EXPORT_FN(CreateBackwardReferences)(
    size_t num_bytes, size_t position,
    const uint8_t* ringbuffer, size_t ringbuffer_mask,
    ContextLut literal_context_lut, const BrotliEncoderParams* params,
    Hasher* hasher, int* dist_cache, size_t* last_insert_len,
    Command* commands, size_t* num_commands, size_t* num_literals,
    const BackwardReferenceFromDecoder* backward_references,
    size_t* back_refs_position, size_t back_refs_size) {
  HASHER()* privat = &hasher->privat.FN(_);
  /* Set maximum distance, see section 9.1. of the spec. */
  const size_t max_backward_limit = BROTLI_MAX_BACKWARD_LIMIT(params->lgwin);
  const size_t position_offset = params->stream_offset;

  const Command* const orig_commands = commands;
  size_t insert_length = *last_insert_len;
  const size_t pos_end = position + num_bytes;
  const size_t store_end = num_bytes >= FN(StoreLookahead)() ?
      position + num_bytes - FN(StoreLookahead)() + 1 : position;

  /* For speed up heuristics for random data. */
  const size_t random_heuristics_window_size =
      LiteralSpreeLengthForSparseSearch(params);
  size_t apply_random_heuristics = position + random_heuristics_window_size;
  const size_t gap = 0;

  /* Minimum score to accept a backward reference. */
  const score_t kMinScore = BROTLI_SCORE_BASE + 100;

  BROTLI_UNUSED(literal_context_lut);

  FN(PrepareDistanceCache)(privat, dist_cache);

  while (position + FN(HashTypeLength)() < pos_end) {
    size_t max_length = pos_end - position;
    size_t max_distance = BROTLI_MIN(size_t, position, max_backward_limit);
    size_t dictionary_start = BROTLI_MIN(size_t,
        position + position_offset, max_backward_limit);
    HasherSearchResult sr;
    sr.len = 0;
    sr.len_code_delta = 0;
    sr.distance = 0;
    sr.score = kMinScore;
    sr.used_stored = BROTLI_FALSE;
    FN(FindLongestMatch)(privat, &params->dictionary,
        ringbuffer, ringbuffer_mask, dist_cache, position, max_length,
        max_distance, dictionary_start + gap, params->dist.max_distance,
        backward_references, back_refs_position, back_refs_size, &sr);
    if (sr.score > kMinScore) {
      /* Found a match. Let's look for something even better ahead. */
      int delayed_backward_references_in_row = 0;
      --max_length;
      /* If a reference from backward_references array was found
         then just take it */
      if (!sr.used_stored) {
          for (;; --max_length) {
            const score_t cost_diff_lazy = 175;
            HasherSearchResult sr2;
            sr2.len = params->quality < MIN_QUALITY_FOR_EXTENSIVE_REFERENCE_SEARCH ?
                BROTLI_MIN(size_t, sr.len - 1, max_length) : 0;
            sr2.len_code_delta = 0;
            sr2.distance = 0;
            sr2.score = kMinScore;
            sr2.used_stored = BROTLI_FALSE;
            max_distance = BROTLI_MIN(size_t, position + 1, max_backward_limit);
            dictionary_start = BROTLI_MIN(size_t,
                position + 1 + position_offset, max_backward_limit);
            FN(FindLongestMatch)(privat,
                &params->dictionary,
                ringbuffer, ringbuffer_mask, dist_cache, position + 1, max_length,
                max_distance, dictionary_start + gap, params->dist.max_distance,
                backward_references, back_refs_position, back_refs_size, &sr2);
            if (sr2.score >= sr.score + cost_diff_lazy || sr2.used_stored) {
              /* Ok, let's just write one byte for now and start a match from the
                 next byte. */
              ++position;
              ++insert_length;
              sr = sr2;
              /* If a reference from backward_references array was found
                 then just take it */
              if (sr2.used_stored) {
                ++delayed_backward_references_in_row;
                break;
              }
              if (++delayed_backward_references_in_row < 4 &&
                  position + FN(HashTypeLength)() < pos_end) {
                continue;
              }
            }
            break;
          }
      }
      apply_random_heuristics =
          position + 2 * sr.len + random_heuristics_window_size;
      dictionary_start = BROTLI_MIN(size_t,
          position + position_offset, max_backward_limit);
      {
        /* The first 16 codes are special short-codes,
           and the minimum offset is 1. */
        size_t distance_code = ComputeDistanceCode(
            sr.distance, dictionary_start + gap, dist_cache);
        if ((sr.distance <= (dictionary_start + gap)) && distance_code > 0) {
          dist_cache[3] = dist_cache[2];
          dist_cache[2] = dist_cache[1];
          dist_cache[1] = dist_cache[0];
          dist_cache[0] = (int)sr.distance;
          FN(PrepareDistanceCache)(privat, dist_cache);
        }
        InitCommand(commands++, &params->dist, insert_length,
            sr.len, sr.len_code_delta, distance_code);
      }
      *num_literals += insert_length;
      insert_length = 0;
      /* Put the hash keys into the table, if there are enough bytes left.
         Depending on the hasher implementation, it can push all positions
         in the given range or only a subset of them.
         Avoid hash poisoning with RLE data. */
      {
        size_t range_start = position + 2;
        size_t range_end = BROTLI_MIN(size_t, position + sr.len, store_end);
        if (sr.distance < (sr.len >> 2)) {
          range_start = BROTLI_MIN(size_t, range_end, BROTLI_MAX(size_t,
              range_start, position + sr.len - (sr.distance << 2)));
        }
        FN(StoreRange)(privat, ringbuffer, ringbuffer_mask, range_start,
                       range_end);
      }
      position += sr.len;
    } else {
      ++insert_length;
      ++position;
      /* If we have not seen matches for a long time, we can skip some
         match lookups. Unsuccessful match lookups are very very expensive
         and this kind of a heuristic speeds up compression quite
         a lot. */
      if (position > apply_random_heuristics && back_refs_size == 0) {
        /* Going through uncompressible data, jump. */
        if (position >
            apply_random_heuristics + 4 * random_heuristics_window_size) {
          /* It is quite a long time since we saw a copy, so we assume
             that this data is not compressible, and store hashes less
             often. Hashes of non compressible data are less likely to
             turn out to be useful in the future, too, so we store less of
             them to not to flood out the hash table of good compressible
             data. */
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 4);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 16, pos_end - kMargin);
          for (; position < pos_jump; position += 4) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 4;
          }
        } else {
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 2);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 8, pos_end - kMargin);
          for (; position < pos_jump; position += 2) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 2;
          }
        }
      }
    }
  }
  insert_length += pos_end - position;
  *last_insert_len = insert_length;
  *num_commands += (size_t)(commands - orig_commands);
}